

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_malloc.c
# Opt level: O0

void opj_aligned_free(void *ptr)

{
  void *ptr_local;
  
  free(ptr);
  return;
}

Assistant:

void opj_aligned_free(void* ptr)
{
#if defined(OPJ_HAVE_POSIX_MEMALIGN) || defined(OPJ_HAVE_MEMALIGN)
  free( ptr );
#elif defined(OPJ_HAVE__ALIGNED_MALLOC)
  _aligned_free( ptr );
#else
  /* Generic implementation has malloced pointer stored in front of used area */
  if (ptr != NULL) {
    free(((void**) ptr)[-1]);
  }
#endif
}